

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O3

Error asmjit::v1_14::Formatter::formatFuncValuePack
                (String *sb,FormatFlags formatFlags,BaseCompiler *cc,FuncValuePack *pack,
                RegOnly *vRegs)

{
  long lVar1;
  int iVar2;
  Error EVar3;
  uint uVar4;
  char *pcVar5;
  ulong uVar6;
  uint32_t valueIndex;
  ulong uVar7;
  uint32_t uVar8;
  
  uVar6 = 5;
  do {
    if (uVar6 == 1) {
      EVar3 = String::_opString(sb,kAppend,"void",0xffffffffffffffff);
      return EVar3;
    }
    iVar2 = (int)uVar6;
    uVar6 = uVar6 - 1;
  } while (pack->_values[iVar2 - 2]._data == 0);
  if (uVar6 != 1) {
    String::_opChar(sb,kAppend,'[');
  }
  uVar7 = 0;
  do {
    uVar8 = pack->_values[uVar7]._data;
    if (uVar8 == 0) break;
    if (uVar7 != 0) {
      EVar3 = String::_opString(sb,kAppend,", ",0xffffffffffffffff);
      if (EVar3 != 0) {
        return EVar3;
      }
      uVar8 = pack->_values[uVar7]._data;
    }
    EVar3 = formatTypeId(sb,(TypeId)uVar8);
    if (EVar3 != 0) {
      return EVar3;
    }
    if ((uVar8 & 0x300) != 0) {
      EVar3 = String::_opChar(sb,kAppend,'@');
      if (EVar3 != 0) {
        return EVar3;
      }
      if (((uVar8 >> 10 & 1) != 0) && (EVar3 = String::_opChar(sb,kAppend,'['), EVar3 != 0)) {
        return EVar3;
      }
      if (((uVar8 >> 8 & 1) != 0) &&
         (EVar3 = formatRegister(sb,formatFlags,(BaseEmitter *)cc,
                                 (cc->super_BaseBuilder).super_BaseEmitter._environment._arch,
                                 (RegType)(uVar8 >> 0x18),uVar8 >> 0x10 & 0xff), EVar3 != 0)) {
        return EVar3;
      }
      if (((uVar8 >> 9 & 1) != 0) &&
         (EVar3 = String::_opFormat(sb,kAppend,"[%d]",(ulong)(uint)((int)uVar8 >> 0xc)), EVar3 != 0)
         ) {
        return EVar3;
      }
      if (((uVar8 >> 10 & 1) != 0) && (EVar3 = String::_opChar(sb,kAppend,']'), EVar3 != 0)) {
        return EVar3;
      }
    }
    if (vRegs != (RegOnly *)0x0) {
      pcVar5 = "<none>";
      if (vRegs[uVar7]._signature._bits != 0) {
        uVar4 = vRegs[uVar7]._id - 0x100;
        pcVar5 = "<none>";
        if (uVar4 < *(uint *)&cc->field_0x1f0) {
          lVar1 = *(long *)(*(long *)&cc->_vRegArray + (ulong)uVar4 * 8);
          pcVar5 = "<none>";
          if (lVar1 != 0) {
            if (*(uint *)(lVar1 + 0x18) < 0xc) {
              pcVar5 = (char *)(lVar1 + 0x1c);
            }
            else {
              pcVar5 = *(char **)(lVar1 + 0x20);
            }
          }
        }
      }
      EVar3 = String::_opFormat(sb,kAppend," %s",pcVar5);
      if (EVar3 != 0) {
        return EVar3;
      }
    }
    uVar7 = uVar7 + 1;
  } while (uVar7 < uVar6);
  if (uVar6 != 1) {
    String::_opChar(sb,kAppend,']');
  }
  return 0;
}

Assistant:

static Error formatFuncValuePack(
  String& sb,
  FormatFlags formatFlags,
  const BaseCompiler* cc,
  const FuncValuePack& pack,
  const RegOnly* vRegs) noexcept {

  size_t count = pack.count();
  if (!count)
    return sb.append("void");

  if (count > 1)
    sb.append('[');

  for (uint32_t valueIndex = 0; valueIndex < count; valueIndex++) {
    const FuncValue& value = pack[valueIndex];
    if (!value)
      break;

    if (valueIndex)
      ASMJIT_PROPAGATE(sb.append(", "));

    ASMJIT_PROPAGATE(formatFuncValue(sb, formatFlags, cc, value));

    if (vRegs) {
      const VirtReg* virtReg = nullptr;
      static const char nullReg[] = "<none>";

      if (vRegs[valueIndex].isReg() && cc->isVirtIdValid(vRegs[valueIndex].id()))
        virtReg = cc->virtRegById(vRegs[valueIndex].id());

      ASMJIT_PROPAGATE(sb.appendFormat(" %s", virtReg ? virtReg->name() : nullReg));
    }
  }

  if (count > 1)
    sb.append(']');

  return kErrorOk;
}